

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

void __thiscall
QToolBarAreaLayout::getStyleOptionInfo
          (QToolBarAreaLayout *this,QStyleOptionToolBar *option,QToolBar *toolBar)

{
  QToolBarAreaLayoutLine *pQVar1;
  ulong uVar2;
  int iVar3;
  undefined4 extraout_var;
  QToolBar *pQVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  
  lVar5 = 0;
  do {
    if (this->docks[lVar5].lines.d.size != 0) {
      uVar6 = 0;
      do {
        pQVar1 = this->docks[lVar5].lines.d.ptr;
        iVar3 = 0;
        bVar9 = pQVar1[uVar6].toolBarItems.d.size != 0;
        if (bVar9) {
          iVar3 = (*(pQVar1[uVar6].toolBarItems.d.ptr)->widgetItem->_vptr_QLayoutItem[0xd])();
          if ((QToolBar *)CONCAT44(extraout_var,iVar3) == toolBar) {
            uVar7 = 0;
          }
          else {
            lVar8 = 0x18;
            uVar7 = 0;
            do {
              uVar7 = uVar7 + 1;
              uVar2 = pQVar1[uVar6].toolBarItems.d.size;
              bVar9 = uVar7 < uVar2;
              if (uVar2 <= uVar7) {
                iVar3 = 0;
                goto LAB_004b9931;
              }
              pQVar4 = (QToolBar *)
                       (**(code **)(**(long **)((long)&(pQVar1[uVar6].toolBarItems.d.ptr)->
                                                       widgetItem + lVar8) + 0x68))();
              lVar8 = lVar8 + 0x18;
            } while (pQVar4 != toolBar);
          }
          lVar8 = pQVar1[uVar6].toolBarItems.d.size;
          if (lVar8 == 1) {
            option->positionWithinLine = OnlyOne;
          }
          else if (uVar7 == 0) {
            option->positionWithinLine = Beginning;
          }
          else if (lVar8 - 1U == uVar7) {
            option->positionWithinLine = End;
          }
          else {
            option->positionWithinLine = Middle;
          }
          lVar8 = this->docks[lVar5].lines.d.size;
          if (lVar8 == 1) {
            option->positionOfLine = OnlyOne;
          }
          else if (uVar6 == 0) {
            option->positionOfLine = Beginning;
          }
          else if (lVar8 - 1U == uVar6) {
            option->positionOfLine = End;
          }
          else {
            option->positionOfLine = Middle;
          }
          iVar3 = 1;
        }
LAB_004b9931:
        if (bVar9) goto LAB_004b9948;
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)this->docks[lVar5].lines.d.size);
    }
    iVar3 = 5;
LAB_004b9948:
    if (((iVar3 != 5) && (iVar3 != 0)) || (lVar5 = lVar5 + 1, lVar5 == 4)) {
      return;
    }
  } while( true );
}

Assistant:

void QToolBarAreaLayout::getStyleOptionInfo(QStyleOptionToolBar *option, QToolBar *toolBar) const
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = dock.lines.at(j);

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                if (line.toolBarItems.at(k).widgetItem->widget() == toolBar) {
                    if (line.toolBarItems.size() == 1)
                        option->positionWithinLine = QStyleOptionToolBar::OnlyOne;
                    else if (k == 0)
                        option->positionWithinLine = QStyleOptionToolBar::Beginning;
                    else if (k == line.toolBarItems.size() - 1)
                        option->positionWithinLine = QStyleOptionToolBar::End;
                    else
                        option->positionWithinLine = QStyleOptionToolBar::Middle;

                    if (dock.lines.size() == 1)
                        option->positionOfLine = QStyleOptionToolBar::OnlyOne;
                    else if (j == 0)
                        option->positionOfLine = QStyleOptionToolBar::Beginning;
                    else if (j == dock.lines.size() - 1)
                        option->positionOfLine = QStyleOptionToolBar::End;
                    else
                        option->positionOfLine = QStyleOptionToolBar::Middle;

                    return;
                }
            }
        }
    }
}